

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Options::AddSwitch(Options *this,bool *var,char flag,string *long_flag,string *description,
                  bool default_val,string *group)

{
  mapped_type *this_00;
  option op;
  anon_class_8_1_ba1d8287 local_b0;
  string local_a8;
  string local_88;
  string local_68;
  option local_48;
  
  std::__cxx11::string::string((string *)&local_68,long_flag);
  std::__cxx11::string::string((string *)&local_88,description);
  std::__cxx11::string::string((string *)&local_a8,group);
  add_entry<bool&>(this,&local_48,flag,&local_68,&local_88,&local_a8,false);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  local_48.has_arg = 2;
  *var = default_val;
  local_b0.var = var;
  this_00 = std::
            map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
            ::operator[](&this->setters,&local_48.val);
  std::function<void(std::__cxx11::string)>::operator=
            ((function<void(std::__cxx11::string)> *)this_00,&local_b0);
  std::vector<option,_std::allocator<option>_>::push_back(&this->options,&local_48);
  return;
}

Assistant:

inline void Options::AddSwitch(bool& var, char flag, std::string long_flag, std::string description, bool default_val, std::string group) {
    struct option op;
    this->add_entry<bool&>(op, flag, long_flag, description, group);

    op.has_arg = optional_argument;
    var = default_val;

    this->setters[op.val] = [&var](std::string) {
        var = !var;
    };

    this->options.push_back(op);
}